

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O3

SimplePropertyExprSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::SimplePropertyExprSyntax,slang::syntax::SequenceExprSyntax&>
          (BumpAllocator *this,SequenceExprSyntax *args)

{
  SimplePropertyExprSyntax *pSVar1;
  
  pSVar1 = (SimplePropertyExprSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((SimplePropertyExprSyntax *)this->endPtr < pSVar1 + 1) {
    pSVar1 = (SimplePropertyExprSyntax *)allocateSlow(this,0x20,8);
  }
  else {
    this->head->current = (byte *)(pSVar1 + 1);
  }
  (pSVar1->super_PropertyExprSyntax).super_SyntaxNode.kind = SimplePropertyExpr;
  (pSVar1->super_PropertyExprSyntax).super_SyntaxNode.parent = (SyntaxNode *)0x0;
  (pSVar1->super_PropertyExprSyntax).super_SyntaxNode.previewNode = (SyntaxNode *)0x0;
  (pSVar1->expr).ptr = args;
  (args->super_SyntaxNode).parent = (SyntaxNode *)pSVar1;
  return pSVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }